

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O1

int __thiscall NetOptimize::fuse_binaryop_eltwise(NetOptimize *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar1;
  Layer *pLVar2;
  int *piVar3;
  Layer *pLVar4;
  pointer ppLVar5;
  undefined4 *puVar6;
  pointer piVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  Layer *pLVar11;
  bool *pbVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  ParamDict pd;
  Mat local_98;
  Layer *local_48;
  ParamDict local_40;
  
  pvVar1 = (this->super_ModelWriter).layers;
  lVar14 = (long)(pvVar1->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar1->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_start;
  if (lVar14 != 0) {
    lVar14 = lVar14 >> 3;
    lVar13 = 0;
    do {
      iVar8 = std::__cxx11::string::compare
                        ((char *)&(((this->super_ModelWriter).layers)->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[lVar13]->type);
      if (iVar8 == 0) {
        pLVar2 = (((this->super_ModelWriter).layers)->
                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar13];
        piVar3 = (pLVar2->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((((long)(pLVar2->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar3 == 8) &&
            (*(int *)&pLVar2[1]._vptr_Layer == 0)) &&
           (*(int *)((long)&pLVar2[1]._vptr_Layer + 4) == 0)) {
          iVar8 = piVar3[1];
          if (lVar13 == 0) {
            lVar16 = 0;
          }
          else {
            iVar10 = *piVar3;
            lVar16 = 0;
            do {
              iVar9 = std::__cxx11::string::compare
                                ((char *)&(((this->super_ModelWriter).layers)->
                                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                          )._M_impl.super__Vector_impl_data._M_start[lVar16]->type);
              if (((iVar9 == 0) &&
                  (pLVar4 = (((this->super_ModelWriter).layers)->
                            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                            _M_impl.super__Vector_impl_data._M_start[lVar16],
                  (long)(pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  *(long *)&(pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data == 4)) &&
                 ((*(int *)&pLVar4[1]._vptr_Layer == 2 &&
                  (*(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start == iVar10)))) break;
              lVar16 = lVar16 + 1;
            } while (lVar13 != lVar16);
          }
          lVar15 = 0;
          if (lVar13 != 0) {
            do {
              iVar10 = std::__cxx11::string::compare
                                 ((char *)&(((this->super_ModelWriter).layers)->
                                           super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                           )._M_impl.super__Vector_impl_data._M_start[lVar15]->type)
              ;
              if (((iVar10 == 0) &&
                  (pLVar4 = (((this->super_ModelWriter).layers)->
                            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                            _M_impl.super__Vector_impl_data._M_start[lVar15],
                  (long)(pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  *(long *)&(pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data == 4)) &&
                 ((*(int *)&pLVar4[1]._vptr_Layer == 2 &&
                  (*(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start == iVar8)))) break;
              lVar15 = lVar15 + 1;
            } while (lVar13 != lVar15);
          }
          if ((lVar16 != lVar13) || (lVar15 != lVar13)) {
            ppLVar5 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            local_48 = ppLVar5[lVar16];
            pLVar4 = ppLVar5[lVar15];
            fprintf(_stderr,"fuse_binaryop_eltwise %s %s %s\n",(local_48->name)._M_dataplus._M_p,
                    (pLVar4->name)._M_dataplus._M_p,(pLVar2->name)._M_dataplus._M_p);
            pLVar11 = ncnn::create_layer("Eltwise");
            std::__cxx11::string::_M_replace
                      ((ulong)&pLVar11->type,0,(char *)(pLVar11->type)._M_string_length,0x55a529);
            std::__cxx11::string::_M_assign((string *)&pLVar11->name);
            this_00 = &pLVar11->bottoms;
            std::vector<int,_std::allocator<int>_>::operator=(this_00,&pLVar2->bottoms);
            std::vector<int,_std::allocator<int>_>::operator=(&pLVar11->tops,&pLVar2->tops);
            ncnn::ParamDict::ParamDict(&local_40);
            (*pLVar11->_vptr_Layer[2])(pLVar11,&local_40);
            *(undefined4 *)&pLVar11[1]._vptr_Layer = 1;
            local_98.cstep = 0;
            local_98.data = (void *)0x0;
            local_98.refcount._0_4_ = 0;
            local_98.refcount._4_4_ = 0;
            local_98.elemsize._0_4_ = 0;
            local_98.elemsize._4_4_ = 0;
            local_98.elempack = 0;
            local_98.h = 0;
            local_98.d = 0;
            local_98.c = 0;
            local_98.allocator = (Allocator *)0x0;
            local_98.dims = 0;
            local_98.w = 0;
            ncnn::Mat::create(&local_98,2,4,(Allocator *)0x0);
            pbVar12 = &pLVar11[1].one_blob_only;
            if ((Mat *)pbVar12 != &local_98) {
              piVar3 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
              if (piVar3 != (int *)0x0) {
                LOCK();
                *piVar3 = *piVar3 + 1;
                UNLOCK();
              }
              piVar3 = *(int **)&pLVar11[1].support_tensor_storage;
              if (piVar3 != (int *)0x0) {
                LOCK();
                *piVar3 = *piVar3 + -1;
                UNLOCK();
                if (*piVar3 == 0) {
                  if (*(long **)&pLVar11[1].typeindex == (long *)0x0) {
                    if (*(void **)&pLVar11[1].one_blob_only != (void *)0x0) {
                      free(*(void **)&pLVar11[1].one_blob_only);
                    }
                  }
                  else {
                    (**(code **)(**(long **)&pLVar11[1].typeindex + 0x18))();
                  }
                }
              }
              *(undefined8 *)((long)&pLVar11[1].type.field_2 + 8) = 0;
              pLVar11[1].support_reserved_2 = false;
              pLVar11[1].support_reserved_3 = false;
              pLVar11[1].support_reserved_4 = false;
              pLVar11[1].support_reserved_5 = false;
              pLVar11[1].support_reserved_6 = false;
              pLVar11[1].support_reserved_7 = false;
              pLVar11[1].support_reserved_8 = false;
              pLVar11[1].support_reserved_9 = false;
              *(undefined8 *)&pLVar11[1].support_reserved_10 = 0;
              pLVar11[1].one_blob_only = false;
              pLVar11[1].support_inplace = false;
              pLVar11[1].support_vulkan = false;
              pLVar11[1].support_packing = false;
              pLVar11[1].support_bf16_storage = false;
              pLVar11[1].support_fp16_storage = false;
              pLVar11[1].support_int8_storage = false;
              pLVar11[1].support_image_storage = false;
              pLVar11[1].support_tensor_storage = false;
              pLVar11[1].support_reserved_00 = false;
              pLVar11[1].support_reserved_0 = false;
              pLVar11[1].support_reserved_1 = false;
              pLVar11[1].support_reserved_2 = false;
              pLVar11[1].support_reserved_3 = false;
              pLVar11[1].support_reserved_4 = false;
              pLVar11[1].support_reserved_5 = false;
              pLVar11[1].type._M_dataplus._M_p = (pointer)0x0;
              pLVar11[1].type._M_string_length = 0;
              *(undefined4 *)&pLVar11[1].type.field_2 = 0;
              *(void **)&pLVar11[1].one_blob_only = local_98.data;
              pLVar11[1].support_tensor_storage = (bool)(char)local_98.refcount._0_4_;
              pLVar11[1].support_reserved_00 = (bool)(char)((uint)local_98.refcount._0_4_ >> 8);
              pLVar11[1].support_reserved_0 = (bool)(char)((uint)local_98.refcount._0_4_ >> 0x10);
              pLVar11[1].support_reserved_1 = (bool)(char)((uint)local_98.refcount._0_4_ >> 0x18);
              pLVar11[1].support_reserved_2 = (bool)(char)local_98.refcount._4_4_;
              pLVar11[1].support_reserved_3 = (bool)(char)((uint)local_98.refcount._4_4_ >> 8);
              pLVar11[1].support_reserved_4 = (bool)(char)((uint)local_98.refcount._4_4_ >> 0x10);
              pLVar11[1].support_reserved_5 = (bool)(char)((uint)local_98.refcount._4_4_ >> 0x18);
              pLVar11[1].support_reserved_6 = (bool)(char)(undefined4)local_98.elemsize;
              pLVar11[1].support_reserved_7 = (bool)(char)((uint)(undefined4)local_98.elemsize >> 8)
              ;
              pLVar11[1].support_reserved_8 =
                   (bool)(char)((uint)(undefined4)local_98.elemsize >> 0x10);
              pLVar11[1].support_reserved_9 =
                   (bool)(char)((uint)(undefined4)local_98.elemsize >> 0x18);
              pLVar11[1].support_reserved_10 = (bool)(char)local_98.elemsize._4_4_;
              pLVar11[1].support_reserved_11 = (bool)(char)((uint)local_98.elemsize._4_4_ >> 8);
              pLVar11[1].support_reserved_12 = (bool)(char)((uint)local_98.elemsize._4_4_ >> 0x10);
              pLVar11[1].support_reserved_13 = (bool)(char)((uint)local_98.elemsize._4_4_ >> 0x18);
              *(int *)&pLVar11[1].userdata = local_98.elempack;
              *(Allocator **)&pLVar11[1].typeindex = local_98.allocator;
              *(int *)&pLVar11[1].type._M_dataplus._M_p = local_98.dims;
              *(int *)((long)&pLVar11[1].type._M_dataplus._M_p + 4) = local_98.w;
              *(int *)&pLVar11[1].type._M_string_length = local_98.h;
              *(int *)((long)&pLVar11[1].type._M_string_length + 4) = local_98.d;
              *(int *)&pLVar11[1].type.field_2 = local_98.c;
              *(size_t *)((long)&pLVar11[1].type.field_2 + 8) = local_98.cstep;
            }
            piVar3 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (local_98.allocator == (Allocator *)0x0) {
                  if (local_98.data != (void *)0x0) {
                    free(local_98.data);
                  }
                }
                else {
                  (*(local_98.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            local_98.cstep = 0;
            local_98.data = (void *)0x0;
            local_98.refcount._0_4_ = 0;
            local_98.refcount._4_4_ = 0;
            local_98.elemsize._0_4_ = 0;
            local_98.elemsize._4_4_ = 0;
            local_98.elempack = 0;
            local_98.dims = 0;
            local_98.w = 0;
            local_98.h = 0;
            local_98.d = 0;
            local_98.c = 0;
            if (lVar16 != lVar13 && lVar15 != lVar13) {
              puVar6 = *(undefined4 **)pbVar12;
              *puVar6 = *(undefined4 *)&local_48[1].one_blob_only;
              puVar6[1] = *(undefined4 *)&pLVar4[1].one_blob_only;
              piVar7 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              *piVar7 = *(local_48->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
              piVar7[1] = *(pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
              std::__cxx11::string::_M_replace
                        ((ulong)&local_48->type,0,(char *)(local_48->type)._M_string_length,0x55a19a
                        );
              std::__cxx11::string::_M_replace
                        ((ulong)&pLVar4->type,0,(char *)(pLVar4->type)._M_string_length,0x55a19a);
            }
            if (lVar16 != lVar13 && lVar15 == lVar13) {
              puVar6 = *(undefined4 **)pbVar12;
              *puVar6 = *(undefined4 *)&local_48[1].one_blob_only;
              puVar6[1] = 0x3f800000;
              *(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start =
                   *(local_48->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
              std::__cxx11::string::_M_replace
                        ((ulong)&local_48->type,0,(char *)(local_48->type)._M_string_length,0x55a19a
                        );
            }
            if (lVar15 != lVar13 && lVar16 == lVar13) {
              puVar6 = *(undefined4 **)pbVar12;
              *puVar6 = 0x3f800000;
              puVar6[1] = *(undefined4 *)&pLVar4[1].one_blob_only;
              (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[1] =
                   *(pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
              std::__cxx11::string::_M_replace
                        ((ulong)&pLVar4->type,0,(char *)(pLVar4->type)._M_string_length,0x55a19a);
            }
            (((this->super_ModelWriter).layers)->
            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar13] = pLVar11;
            if (pLVar2 != (Layer *)0x0) {
              (*pLVar2->_vptr_Layer[1])(pLVar2);
            }
            ncnn::ParamDict::~ParamDict(&local_40);
          }
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != lVar14 + (ulong)(lVar14 == 0));
  }
  return 0;
}

Assistant:

int NetOptimize::fuse_binaryop_eltwise()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "BinaryOp")
            continue;

        if (layers[i]->bottoms.size() != 2)
            continue;

        ncnn::BinaryOp* binaryop = (ncnn::BinaryOp*)layers[i];

        if (binaryop->op_type != ncnn::BinaryOp::Operation_ADD)
            continue;

        if (binaryop->with_scalar)
            continue;

        // BinaryOp - BinaryOp - BinaryOp
        int bottom_blob_index_0 = binaryop->bottoms[0];
        int bottom_blob_index_1 = binaryop->bottoms[1];

        size_t j0 = 0;
        for (; j0 < i; j0++)
        {
            if (layers[j0]->type != "BinaryOp")
                continue;

            if (layers[j0]->bottoms.size() != 1)
                continue;

            if (((ncnn::BinaryOp*)layers[j0])->op_type != ncnn::BinaryOp::Operation_MUL)
                continue;

            if (layers[j0]->tops[0] == bottom_blob_index_0)
                break;
        }

        size_t j1 = 0;
        for (; j1 < i; j1++)
        {
            if (layers[j1]->type != "BinaryOp")
                continue;

            if (layers[j1]->bottoms.size() != 1)
                continue;

            if (((ncnn::BinaryOp*)layers[j1])->op_type != ncnn::BinaryOp::Operation_MUL)
                continue;

            if (layers[j1]->tops[0] == bottom_blob_index_1)
                break;
        }

        if (j0 == i && j1 == i)
            continue;

        ncnn::BinaryOp* binaryop0 = (ncnn::BinaryOp*)layers[j0];
        ncnn::BinaryOp* binaryop1 = (ncnn::BinaryOp*)layers[j1];

        fprintf(stderr, "fuse_binaryop_eltwise %s %s %s\n", binaryop0->name.c_str(), binaryop1->name.c_str(), binaryop->name.c_str());

        ncnn::Eltwise* eltwise = (ncnn::Eltwise*)ncnn::create_layer("Eltwise");

        eltwise->type = "Eltwise";
        eltwise->name = binaryop->name;
        eltwise->bottoms = binaryop->bottoms;
        eltwise->tops = binaryop->tops;

        ncnn::ParamDict pd;
        eltwise->load_param(pd);

        eltwise->op_type = ncnn::Eltwise::Operation_SUM;

        eltwise->coeffs = ncnn::Mat(2);

        if (j0 != i && j1 != i)
        {
            // fuse BinaryOp - BinaryOp - BinaryOp to Eltwise
            eltwise->coeffs[0] = binaryop0->b;
            eltwise->coeffs[1] = binaryop1->b;

            eltwise->bottoms[0] = binaryop0->bottoms[0];
            eltwise->bottoms[1] = binaryop1->bottoms[0];

            binaryop0->type = "ncnnfused";
            binaryop1->type = "ncnnfused";
        }
        if (j0 != i && j1 == i)
        {
            // fuse BinaryOp - X - BinaryOp to Eltwise
            eltwise->coeffs[0] = binaryop0->b;
            eltwise->coeffs[1] = 1.f;

            eltwise->bottoms[0] = binaryop0->bottoms[0];

            binaryop0->type = "ncnnfused";
        }
        if (j0 == i && j1 != i)
        {
            // fuse X - BinaryOp - BinaryOp to Eltwise
            eltwise->coeffs[0] = 1.f;
            eltwise->coeffs[1] = binaryop1->b;

            eltwise->bottoms[1] = binaryop1->bottoms[0];

            binaryop1->type = "ncnnfused";
        }

        layers[i] = eltwise;
        delete binaryop;
    }

    return 0;
}